

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O1

void JsStandardHasInstance(JsObject *self,JsValue *instance,JsValue *res)

{
  JsObject *pJVar1;
  undefined1 local_38 [8];
  JsValue res0;
  
  if (instance->type == JS_OBJECT) {
    (*self->Get)(self,"prototype",(int *)0x0,(JsValue *)local_38);
    if (local_38._0_4_ == JS_OBJECT) {
      pJVar1 = (instance->u).object;
      do {
        pJVar1 = pJVar1->Prototype;
        if (pJVar1 == (JsObject *)0x0) goto LAB_00105bcd;
      } while (pJVar1 != (JsObject *)res0._0_8_);
      res->type = JS_BOOLEAN;
      (res->u).boolean = 1;
    }
    else {
      JsThrowString("TypeError");
    }
  }
  else {
LAB_00105bcd:
    res->type = JS_BOOLEAN;
    (res->u).boolean = 0;
  }
  return;
}

Assistant:

void JsStandardHasInstance(struct JsObject *self, struct JsValue *instance,
			struct JsValue* res){
	struct JsValue res0;
	struct JsObject* prototype;
	if(instance->type != JS_OBJECT){
		res->type = JS_BOOLEAN;
		res->u.boolean = FALSE;
		return;
	}
	(*self->Get)(self,"prototype",NULL,&res0);
	if(res0.type != JS_OBJECT){
		JsThrowString("TypeError");
		return;
	}
	prototype = instance->u.object->Prototype;
	//循环查询
	while(prototype != NULL){
		if(prototype == res0.u.object){
			res->type = JS_BOOLEAN;
			res->u.boolean = TRUE;
			return;
		}
		//下一个对象的原形
		prototype = prototype->Prototype;
	}
	//没有查询到
	res->type = JS_BOOLEAN;
	res->u.boolean = FALSE;
}